

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O3

Aig_Man_t * Saig_ManIsoReduce(Aig_Man_t *pAig,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint *puVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  timespec ts;
  timespec local_48;
  Aig_Man_t *local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  local_38 = Iso_ManFilterPos(pAig,pvPosEquivs,fVerbose);
  printf("Reduced %d outputs to %d outputs.  ",(ulong)(uint)pAig->nTruePos,
         (ulong)(uint)local_38->nTruePos);
  iVar6 = 3;
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar6,"%s =","Time");
  Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar7 + lVar5) / 1000000.0);
  if (((fVerbose != 0) && (*pvPosEquivs != (Vec_Ptr_t *)0x0)) &&
     (pAig->nTruePos != (*pvPosEquivs)->nSize)) {
    puts("Nontrivial classes:");
    pVVar2 = *pvPosEquivs;
    iVar3 = pVVar2->nSize;
    if (0 < iVar3) {
      uVar8 = 0;
      do {
        lVar5 = (long)iVar3;
        if (lVar5 <= (long)uVar8) {
LAB_0062d86d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        iVar6 = *(int *)((long)pVVar2->pArray[uVar8] + 4);
        if (0 < iVar6) {
          if (iVar6 != 1) {
            puVar4 = *(uint **)((long)pVVar2->pArray[uVar8] + 8);
            uVar9 = 0;
            do {
              uVar1 = *puVar4;
              if (uVar9 == 0) {
                printf(" %4d : {",uVar8 & 0xffffffff);
              }
              printf(" %d",(ulong)uVar1);
              iVar3 = pVVar2->nSize;
              lVar5 = (long)iVar3;
              if (lVar5 <= (long)uVar8) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                              ,0x100,"int Vec_VecLevelSize(Vec_Vec_t *, int)");
              }
              if (uVar9 == *(int *)((long)pVVar2->pArray[uVar8] + 4) - 1) {
                puts(" }");
                iVar3 = pVVar2->nSize;
                lVar5 = (long)iVar3;
              }
              if (lVar5 <= (long)uVar8) goto LAB_0062d86d;
              uVar9 = uVar9 + 1;
              iVar6 = *(int *)((long)pVVar2->pArray[uVar8] + 4);
            } while (((long)uVar9 < (long)iVar6) &&
                    (puVar4 = (uint *)(uVar9 * 4 + *(long *)((long)pVVar2->pArray[uVar8] + 8)),
                    iVar6 != 1));
          }
          lVar5 = (long)iVar3;
        }
        uVar8 = uVar8 + 1;
      } while ((long)uVar8 < lVar5);
    }
  }
  return local_38;
}

Assistant:

Aig_Man_t * Saig_ManIsoReduce( Aig_Man_t * pAig, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{ 
    Aig_Man_t * pPart;
    abctime clk = Abc_Clock();
    pPart = Iso_ManFilterPos( pAig, pvPosEquivs, fVerbose );
    printf( "Reduced %d outputs to %d outputs.  ", Saig_ManPoNum(pAig), Saig_ManPoNum(pPart) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose && *pvPosEquivs && Saig_ManPoNum(pAig) != Vec_PtrSize(*pvPosEquivs) )
    {
        printf( "Nontrivial classes:\n" );
        Vec_VecPrintInt( (Vec_Vec_t *)*pvPosEquivs, 1 );
    }
//    Aig_ManStopP( &pPart );
    return pPart;
}